

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3MatchSpanName(char *zSpan,char *zCol,char *zTab,char *zDb)

{
  int iVar1;
  char *zLeft;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  bool bVar2;
  int n;
  int local_2c;
  
  local_2c = 0;
  while( true ) {
    bVar2 = false;
    if (in_RDI[local_2c] != '\0') {
      bVar2 = in_RDI[local_2c] != '.';
    }
    if (!bVar2) break;
    local_2c = local_2c + 1;
  }
  if ((in_RCX != (char *)0x0) &&
     ((iVar1 = sqlite3_strnicmp(in_RDI,in_RCX,local_2c), iVar1 != 0 || (in_RCX[local_2c] != '\0'))))
  {
    return 0;
  }
  zLeft = in_RDI + (local_2c + 1);
  local_2c = 0;
  while( true ) {
    bVar2 = false;
    if (zLeft[local_2c] != '\0') {
      bVar2 = zLeft[local_2c] != '.';
    }
    if (!bVar2) break;
    local_2c = local_2c + 1;
  }
  if ((in_RDX != (char *)0x0) &&
     ((iVar1 = sqlite3_strnicmp(zLeft,in_RDX,local_2c), iVar1 != 0 || (in_RDX[local_2c] != '\0'))))
  {
    return 0;
  }
  if ((in_RSI != (char *)0x0) && (iVar1 = sqlite3StrICmp(zLeft + (local_2c + 1),in_RSI), iVar1 != 0)
     ) {
    return 0;
  }
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3MatchSpanName(
  const char *zSpan,
  const char *zCol,
  const char *zTab,
  const char *zDb
){
  int n;
  for(n=0; ALWAYS(zSpan[n]) && zSpan[n]!='.'; n++){}
  if( zDb && (sqlite3StrNICmp(zSpan, zDb, n)!=0 || zDb[n]!=0) ){
    return 0;
  }
  zSpan += n+1;
  for(n=0; ALWAYS(zSpan[n]) && zSpan[n]!='.'; n++){}
  if( zTab && (sqlite3StrNICmp(zSpan, zTab, n)!=0 || zTab[n]!=0) ){
    return 0;
  }
  zSpan += n+1;
  if( zCol && sqlite3StrICmp(zSpan, zCol)!=0 ){
    return 0;
  }
  return 1;
}